

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Value::~Value(Value *this)

{
  CommentInfo *pCVar1;
  char *pcVar2;
  void *__ptr;
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  byte bVar3;
  long lVar4;
  
  bVar3 = (byte)*(ushort *)&this->field_0x8;
  if (bVar3 < 8) {
    if ((0x2fU >> (bVar3 & 0x1f) & 1) == 0) {
      if ((0xc0U >> (bVar3 & 0x1f) & 1) == 0) {
        if ((*(ushort *)&this->field_0x8 >> 8 & 1) != 0) {
          free((this->value_).string_);
        }
      }
      else {
        this_00 = &((this->value_).map_)->_M_t;
        if (this_00 !=
            (_Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
             *)0x0) {
          std::
          _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
          ::~_Rb_tree(this_00);
          operator_delete(this_00,0x30);
        }
      }
    }
    pCVar1 = this->comments_;
    if (pCVar1 != (CommentInfo *)0x0) {
      pcVar2 = pCVar1[-1].comment_;
      if (pcVar2 != (char *)0x0) {
        lVar4 = (long)pcVar2 * 8;
        do {
          __ptr = *(void **)((long)&pCVar1[-1].comment_ + lVar4);
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          lVar4 = lVar4 + -8;
        } while (lVar4 != 0);
      }
      operator_delete__(pCVar1 + -1,(long)pcVar2 * 8 + 8);
    }
    (this->value_).int_ = 0;
    return;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                ,0x201,"Json::Value::~Value()");
}

Assistant:

Value::~Value() {
  switch (type_) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
    break;
  case stringValue:
    if (allocated_)
      releasePrefixedStringValue(value_.string_);
    break;
  case arrayValue:
  case objectValue:
    delete value_.map_;
    break;
  default:
    JSON_ASSERT_UNREACHABLE;
  }

  delete[] comments_;

  value_.uint_ = 0;
}